

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::RegrSState,double,double,duckdb::RegrSYYOperation>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  sel_t *psVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  double dVar6;
  double dVar7;
  long lVar9;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar11 [16];
  UnifiedVectorFormat adata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(a,count,&local_b0);
  Vector::ToUnifiedFormat(b,count,&local_68);
  if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 &&
      local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      dVar7 = *(double *)(state + 0x10);
      dVar6 = *(double *)(state + 0x18);
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if ((local_b0.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(local_b0.sel)->sel_vector[iVar3];
        }
        lVar9 = *(long *)(state + 8) + 1 + iVar3;
        dVar10 = *(double *)(local_b0.data + iVar4 * 8) - dVar7;
        auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar11._0_8_ = lVar9;
        auVar11._12_4_ = 0x45300000;
        dVar7 = dVar7 + dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
        dVar6 = dVar6 + (*(double *)(local_b0.data + iVar4 * 8) - dVar7) * dVar10;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
      *(idx_t *)state = *(long *)state + count;
      *(idx_t *)(state + 8) = *(long *)(state + 8) + count;
      *(double *)(state + 0x10) = dVar7;
      *(double *)(state + 0x18) = dVar6;
    }
  }
  else if (count != 0) {
    psVar1 = (local_b0.sel)->sel_vector;
    psVar2 = (local_68.sel)->sel_vector;
    iVar3 = 0;
    do {
      iVar4 = iVar3;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar3];
      }
      iVar5 = iVar3;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[iVar3];
      }
      if (((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
            >> (iVar4 & 0x3f) & 1) != 0)) &&
         ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)))) {
        lVar9 = *(long *)(state + 8) + 1;
        *(long *)state = *(long *)state + 1;
        *(long *)(state + 8) = lVar9;
        dVar7 = *(double *)(local_b0.data + iVar4 * 8);
        dVar10 = dVar7 - *(double *)(state + 0x10);
        auVar8._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar8._0_8_ = lVar9;
        auVar8._12_4_ = 0x45300000;
        dVar6 = dVar10 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) +
                *(double *)(state + 0x10);
        *(double *)(state + 0x10) = dVar6;
        *(double *)(state + 0x18) = (dVar7 - dVar6) * dVar10 + *(double *)(state + 0x18);
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}